

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O2

WriterData * __thiscall
WaitableSafeQueue<WriterData>::pop
          (WriterData *__return_storage_ptr__,WaitableSafeQueue<WriterData> *this)

{
  bool bVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->m_mtx);
  while( true ) {
    bVar1 = SafeQueue<WriterData>::empty((SafeQueue<WriterData> *)this);
    if (!bVar1) break;
    std::condition_variable::wait((unique_lock *)&this->m_cond);
  }
  SafeQueue<WriterData>::pop(__return_storage_ptr__,(SafeQueue<WriterData> *)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

T pop() override
    {
        std::unique_lock lk(m_mtx);

        while (SafeQueue<T>::empty())
        {
            m_cond.wait(lk);
        }

        T val = SafeQueue<T>::pop();

        return val;
    }